

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastShiftLeftInt
               (Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
               Vec_Int_t *vRes)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int local_64;
  
  piVar4 = Wlc_VecCopy(vRes,pNum,nNum);
  if (fSticky == 0) {
    local_64 = 0;
  }
  else {
    local_64 = *pNum;
  }
  if (nShift < 0x21) {
    uVar5 = 0;
    uVar6 = (ulong)(uint)nShift;
    if (nShift < 1) {
      uVar6 = uVar5;
    }
    bVar1 = false;
    for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      iVar2 = 1 << ((byte)uVar5 & 0x1f);
      for (lVar7 = (long)nNum; fSticky < lVar7; lVar7 = lVar7 + -1) {
        if ((bVar1) || (lVar7 <= iVar2)) {
          iVar3 = Gia_ManHashMux(pNew,pShift[uVar5],local_64,piVar4[lVar7 + -1]);
          piVar4[lVar7 + -1] = iVar3;
          if (nNum < iVar2) {
            bVar1 = true;
          }
        }
        else {
          iVar3 = Gia_ManHashMux(pNew,pShift[uVar5],piVar4[(lVar7 + -1) - (long)iVar2],
                                 piVar4[lVar7 + -1]);
          piVar4[lVar7 + -1] = iVar3;
          bVar1 = false;
        }
      }
    }
    return;
  }
  __assert_fail("nShift <= 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                ,0xc1,
                "void Wlc_BlastShiftLeftInt(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)")
  ;
}

Assistant:

void Wlc_BlastShiftLeftInt( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int * pRes = Wlc_VecCopy( vRes, pNum, nNum );
    int Fill = fSticky ? pNum[0] : 0;
    int i, j, fShort = 0;
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++ ) 
        for( j = nNum-1; j >= fSticky; j-- ) 
        {
            if( fShort || (1<<i) > j ) 
            {
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], Fill, pRes[j] );
                if ( (1<<i) > nNum ) 
                    fShort = 1;
            } 
            else 
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], pRes[j-(1<<i)], pRes[j] );
        }
}